

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::~WebSocketResponseImpl
          (WebSocketResponseImpl *this)

{
  long *plVar1;
  
  plVar1 = *(long **)(this + 0x28);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(this + 0x28) = 0;
    (**(code **)**(undefined8 **)(this + 0x20))
              (*(undefined8 **)(this + 0x20),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  plVar1 = *(long **)(this + 0x18);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(this + 0x18) = 0;
    (**(code **)**(undefined8 **)(this + 0x10))
              (*(undefined8 **)(this + 0x10),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  Refcounted::~Refcounted((Refcounted *)this);
  return;
}

Assistant:

WebSocketResponseImpl(kj::Own<kj::PromiseFulfiller<HttpClient::WebSocketResponse>> fulfiller)
        : fulfiller(kj::mv(fulfiller)) {}